

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

ffs_dstring raw_to_XML_string(FMContext c,FMFormat_conflict format,void *data,int encoded)

{
  int iVar1;
  ffs_dstring ds;
  ffs_dstring dstr;
  
  iVar1 = FMhas_XML_info((FMFormat_conflict)c);
  ds = new_dstring();
  if (iVar1 == 0) {
    dcatstr(ds,"<");
    dcatstr(ds,*(char **)&c->native_float_format);
    dcatstr(ds,">\n");
    for (iVar1 = 0; iVar1 < *(int *)((long)&c->server_fd + 4); iVar1 = iVar1 + 1) {
      generic_field_to_XML((FMFormat_conflict)c,iVar1,format,format,(int)data,ds);
    }
    dcatstr(ds,"</");
    dcatstr(ds,*(char **)&c->native_float_format);
    dcatstr(ds,">\n");
  }
  else {
    internal_record_to_XML_string((FMFormat_conflict)c,format,format,ds,(int)data);
  }
  return ds;
}

Assistant:

static ffs_dstring
raw_to_XML_string(FMContext c, FMFormat format, void *data, int encoded)
{
    int index;
    ffs_dstring ds;
    if (FMhas_XML_info(format)) {
	return record_to_XML_string(format, data, encoded);
    }
    ds = new_dstring();
    dcatstr(ds, "<");
    dcatstr(ds, format->format_name);
    dcatstr(ds, ">\n");
    for (index = 0; index < format->field_count; index++) {
	generic_field_to_XML(format, index, data, data, 
			     encoded, ds);
    }
    dcatstr(ds, "</");
    dcatstr(ds, format->format_name);
    dcatstr(ds, ">\n");
    return ds;
}